

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryAnim(AssbinExport *this,IOStream *container,aiAnimation *anim)

{
  uint uVar1;
  ulong uVar2;
  AssbinChunkWriter chunk;
  uint32_t t;
  AssbinChunkWriter local_60;
  uint local_24;
  
  local_60.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_007fa3e0;
  local_60.buffer = (uint8_t *)0x0;
  local_60.magic = 0x123b;
  local_60.cur_size = 0;
  local_60.cursor = 0;
  local_60.initial = 0x1000;
  uVar1 = (anim->mName).length;
  local_60.container = container;
  AssbinChunkWriter::Grow(&local_60,4);
  *(ai_uint32 *)(local_60.buffer + local_60.cursor) = (anim->mName).length;
  local_60.cursor = local_60.cursor + 4;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,(anim->mName).data,(ulong)uVar1,1);
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&anim->mDuration,8,1);
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&anim->mTicksPerSecond,8,1);
  local_24 = anim->mNumChannels;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_24,4,1);
  if (anim->mNumChannels != 0) {
    uVar2 = 0;
    do {
      WriteBinaryNodeAnim(this,&local_60.super_IOStream,anim->mChannels[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < anim->mNumChannels);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_60);
  return;
}

Assistant:

void WriteBinaryAnim( IOStream * container, const aiAnimation* anim )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIANIMATION );

        Write<aiString>(&chunk,anim->mName);
        Write<double>(&chunk,anim->mDuration);
        Write<double>(&chunk,anim->mTicksPerSecond);
        Write<unsigned int>(&chunk,anim->mNumChannels);

        for (unsigned int a = 0; a < anim->mNumChannels;++a) {
            const aiNodeAnim* nd = anim->mChannels[a];
            WriteBinaryNodeAnim(&chunk,nd);
        }
    }